

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeinApi.c
# Opt level: O1

int skeinUpdateBits(SkeinCtx_t *ctx,uint8_t *msg,size_t msgBitCnt)

{
  u64b_t *puVar1;
  size_t sVar2;
  int iVar3;
  ulong uVar4;
  byte bVar5;
  
  if ((msgBitCnt == 0) || (iVar3 = 1, ((ctx->m).h.T[1] & 0x80000000000000) == 0)) {
    if ((msgBitCnt & 7) == 0) {
      iVar3 = skeinUpdate(ctx,msg,msgBitCnt >> 3);
      return iVar3;
    }
    skeinUpdate(ctx,msg,(msgBitCnt >> 3) + 1);
    uVar4 = ctx->skeinSize;
    sVar2 = (ctx->m).h.bCnt;
    puVar1 = (ctx->m).h.T + 1;
    *puVar1 = *puVar1 | 0x80000000000000;
    if (sVar2 == 0) {
      __assert_fail("length != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/k3rb3ros[P]three_fizer/src/skein3fish/skeinApi.c"
                    ,0xc5,"int skeinUpdateBits(SkeinCtx_t *, const uint8_t *, size_t)");
    }
    uVar4 = uVar4 >> 3;
    bVar5 = '\x01' << ((byte)(msgBitCnt & 7) ^ 7);
    *(byte *)((long)&ctx->m + sVar2 + uVar4 + 0x1f) =
         -bVar5 & *(byte *)((long)&ctx->m + sVar2 + uVar4 + 0x1f) | bVar5;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int skeinUpdateBits(SkeinCtx_t *ctx, const uint8_t *msg,
                    size_t msgBitCnt)
{
    /*
     * I've used the bit pad implementation from skein_test.c (see NIST CD)
     * and modified it to use the convenience functions and added some pointer
     * arithmetic.
     */
    size_t length;
    uint8_t mask;
    uint8_t* up;

    /* only the final Update() call is allowed do partial bytes, else assert an error */
    Skein_Assert((ctx->m.h.T[1] & SKEIN_T1_FLAG_BIT_PAD) == 0 || msgBitCnt == 0, SKEIN_FAIL);

    /* if number of bits is a multiple of bytes - that's easy */
    if ((msgBitCnt & 0x7) == 0) {
        return skeinUpdate(ctx, msg, msgBitCnt >> 3);
    }
    skeinUpdate(ctx, msg, (msgBitCnt >> 3) + 1);

    /*
     * The next line rely on the fact that the real Skein contexts
     * are a union in our context. After the addition the pointer points to
     * Skein's real partial block buffer.
     * If this layout ever changes we have to adapt this as well.
     */
    up = (uint8_t*)ctx->m.s256.X + ctx->skeinSize / 8;

    Skein_Set_Bit_Pad_Flag(ctx->m.h);                       /* set tweak flag for the skeinFinal call */

    /* now "pad" the final partial byte the way NIST likes */
    length = ctx->m.h.bCnt;                                 /* get the bCnt value (same location for all block sizes) */
    Skein_assert(length != 0);                              /* internal sanity check: there IS a partial byte in the buffer! */
    mask = (uint8_t) (1u << (7 - (msgBitCnt & 7)));         /* partial byte bit mask */
    up[length-1]  = (uint8_t)((up[length-1] & (0-mask))|mask);   /* apply bit padding on final byte (in the buffer) */

    return SKEIN_SUCCESS;
}